

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

bool __thiscall
FlatSigningProvider::GetPubKey(FlatSigningProvider *this,CKeyID *keyid,CPubKey *pubkey)

{
  long lVar1;
  bool bVar2;
  CPubKey *in_RDX;
  CKeyID *in_RSI;
  map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = LookupHelper<std::map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>,CKeyID,CPubKey>
                    (in_RDI,in_RSI,in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatSigningProvider::GetPubKey(const CKeyID& keyid, CPubKey& pubkey) const { return LookupHelper(pubkeys, keyid, pubkey); }